

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void alloc_dec_jobs(AV1DecTileMT *tile_mt_info,AV1_COMMON *cm,int tile_rows,int tile_cols)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  int num_tiles;
  int local_20;
  
  *(int *)(in_RDI + 3) = in_EDX;
  *(int *)((long)in_RDI + 0x1c) = in_ECX;
  pvVar1 = aom_malloc(0x1b38b9);
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate tile_mt_info->job_mutex");
  }
  for (local_20 = 0; local_20 < in_EDX * in_ECX; local_20 = local_20 + 1) {
    pthread_mutex_init((pthread_mutex_t *)(*in_RDI + (long)local_20 * 0x28),
                       (pthread_mutexattr_t *)0x0);
  }
  pvVar1 = aom_malloc(0x1b3939);
  in_RDI[1] = (long)pvVar1;
  if (in_RDI[1] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate tile_mt_info->job_queue");
  }
  return;
}

Assistant:

static inline void alloc_dec_jobs(AV1DecTileMT *tile_mt_info, AV1_COMMON *cm,
                                  int tile_rows, int tile_cols) {
  tile_mt_info->alloc_tile_rows = tile_rows;
  tile_mt_info->alloc_tile_cols = tile_cols;
  int num_tiles = tile_rows * tile_cols;
#if CONFIG_MULTITHREAD
  {
    CHECK_MEM_ERROR(cm, tile_mt_info->job_mutex,
                    aom_malloc(sizeof(*tile_mt_info->job_mutex) * num_tiles));

    for (int i = 0; i < num_tiles; i++) {
      pthread_mutex_init(&tile_mt_info->job_mutex[i], NULL);
    }
  }
#endif
  CHECK_MEM_ERROR(cm, tile_mt_info->job_queue,
                  aom_malloc(sizeof(*tile_mt_info->job_queue) * num_tiles));
}